

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalHashAggregate::Sink
          (PhysicalHashAggregate *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  GlobalSinkState *pGVar1;
  LocalSinkState *pLVar2;
  pointer puVar3;
  pointer puVar4;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  bool bVar6;
  DataChunk *this_00;
  pointer pEVar7;
  BoundAggregateExpression *pBVar8;
  BoundReferenceExpression *pBVar9;
  reference pvVar10;
  reference pvVar11;
  const_iterator cVar12;
  reference this_01;
  reference this_02;
  const_reference this_03;
  pointer puVar13;
  idx_t i;
  size_type __n;
  size_type sVar14;
  ulong __n_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child_expr;
  pointer this_04;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *aggregate;
  OperatorSinkInput sink_input;
  InterruptState interrupt_state;
  
  pGVar1 = input->global_state;
  pLVar2 = input->local_state;
  if ((this->distinct_collection_info).
      super_unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::DistinctAggregateCollectionInfo_*,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      .super__Head_base<0UL,_duckdb::DistinctAggregateCollectionInfo_*,_false>._M_head_impl !=
      (DistinctAggregateCollectionInfo *)0x0) {
    SinkDistinct(this,context,chunk,input);
  }
  bVar6 = CanSkipRegularSink(this);
  if (!bVar6) {
    this_00 = (DataChunk *)(pLVar2 + 1);
    puVar3 = (this->grouped_aggregate_data).aggregates.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __n = 0;
    for (puVar13 = (this->grouped_aggregate_data).aggregates.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar3;
        puVar13 = puVar13 + 1) {
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(puVar13);
      pBVar8 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar7->super_BaseExpression)
      ;
      puVar4 = (pBVar8->children).
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_04 = (pBVar8->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_04 != puVar4;
          this_04 = this_04 + 1) {
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_04);
        pBVar9 = BaseExpression::Cast<duckdb::BoundReferenceExpression>
                           (&pEVar7->super_BaseExpression);
        pvVar10 = vector<duckdb::Vector,_true>::get<true>
                            ((vector<duckdb::Vector,_true> *)this_00,__n);
        pvVar11 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,pBVar9->index);
        Vector::Reference(pvVar10,pvVar11);
        __n = __n + 1;
      }
    }
    puVar3 = (this->grouped_aggregate_data).aggregates.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar13 = (this->grouped_aggregate_data).aggregates.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar3;
        puVar13 = puVar13 + 1) {
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(puVar13);
      pBVar8 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar7->super_BaseExpression)
      ;
      _Var5._M_head_impl =
           (pBVar8->filter).
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      sVar14 = __n;
      if (_Var5._M_head_impl != (Expression *)0x0) {
        interrupt_state._0_8_ = _Var5._M_head_impl;
        cVar12 = ::std::
                 _Hashtable<duckdb::Expression_*,_std::pair<duckdb::Expression_*const,_unsigned_long>,_std::allocator<std::pair<duckdb::Expression_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::Expression_*>,_std::hash<duckdb::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->filter_indexes)._M_h,(key_type *)&interrupt_state);
        sVar14 = __n + 1;
        pvVar10 = vector<duckdb::Vector,_true>::get<true>
                            ((vector<duckdb::Vector,_true> *)this_00,__n);
        pvVar11 = vector<duckdb::Vector,_true>::get<true>
                            (&chunk->data,
                             *(size_type *)
                              ((long)cVar12.
                                     super__Node_iterator_base<std::pair<duckdb::Expression_*const,_unsigned_long>,_false>
                                     ._M_cur + 0x10));
        Vector::Reference(pvVar10,pvVar11);
      }
      __n = sVar14;
    }
    pLVar2[1].partition_info.partition_data.
    super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)chunk->count;
    DataChunk::Verify(this_00);
    for (__n_00 = 0;
        __n_00 < (ulong)(((long)(this->groupings).
                                super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                .
                                super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->groupings).
                               super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                               .
                               super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x70);
        __n_00 = __n_00 + 1) {
      this_01 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::get<true>
                          ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)(pGVar1 + 1),
                           __n_00);
      this_02 = vector<duckdb::HashAggregateGroupingLocalState,_true>::get<true>
                          ((vector<duckdb::HashAggregateGroupingLocalState,_true> *)
                           &pLVar2[2].partition_info.min_batch_index,__n_00);
      InterruptState::InterruptState(&interrupt_state);
      sink_input.global_state =
           unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator*(&this_01->table_state);
      sink_input.local_state =
           unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
           operator*(&this_02->table_state);
      sink_input.interrupt_state = &interrupt_state;
      this_03 = vector<duckdb::HashAggregateGroupingData,_true>::get<true>(&this->groupings,__n_00);
      RadixPartitionedHashTable::Sink
                (&this_03->table_data,context,chunk,&sink_input,this_00,&this->non_distinct_filter);
      InterruptState::~InterruptState(&interrupt_state);
    }
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalHashAggregate::Sink(ExecutionContext &context, DataChunk &chunk,
                                           OperatorSinkInput &input) const {
	auto &local_state = input.local_state.Cast<HashAggregateLocalSinkState>();
	auto &global_state = input.global_state.Cast<HashAggregateGlobalSinkState>();

	if (distinct_collection_info) {
		SinkDistinct(context, chunk, input);
	}

	if (CanSkipRegularSink()) {
		return SinkResultType::NEED_MORE_INPUT;
	}

	DataChunk &aggregate_input_chunk = local_state.aggregate_input_chunk;
	auto &aggregates = grouped_aggregate_data.aggregates;
	idx_t aggregate_input_idx = 0;

	// Populate the aggregate child vectors
	for (auto &aggregate : aggregates) {
		auto &aggr = aggregate->Cast<BoundAggregateExpression>();
		for (auto &child_expr : aggr.children) {
			D_ASSERT(child_expr->GetExpressionType() == ExpressionType::BOUND_REF);
			auto &bound_ref_expr = child_expr->Cast<BoundReferenceExpression>();
			D_ASSERT(bound_ref_expr.index < chunk.data.size());
			aggregate_input_chunk.data[aggregate_input_idx++].Reference(chunk.data[bound_ref_expr.index]);
		}
	}
	// Populate the filter vectors
	for (auto &aggregate : aggregates) {
		auto &aggr = aggregate->Cast<BoundAggregateExpression>();
		if (aggr.filter) {
			auto it = filter_indexes.find(aggr.filter.get());
			D_ASSERT(it != filter_indexes.end());
			D_ASSERT(it->second < chunk.data.size());
			aggregate_input_chunk.data[aggregate_input_idx++].Reference(chunk.data[it->second]);
		}
	}

	aggregate_input_chunk.SetCardinality(chunk.size());
	aggregate_input_chunk.Verify();

	// For every grouping set there is one radix_table
	for (idx_t i = 0; i < groupings.size(); i++) {
		auto &grouping_global_state = global_state.grouping_states[i];
		auto &grouping_local_state = local_state.grouping_states[i];
		InterruptState interrupt_state;
		OperatorSinkInput sink_input {*grouping_global_state.table_state, *grouping_local_state.table_state,
		                              interrupt_state};

		auto &grouping = groupings[i];
		auto &table = grouping.table_data;
		table.Sink(context, chunk, sink_input, aggregate_input_chunk, non_distinct_filter);
	}

	return SinkResultType::NEED_MORE_INPUT;
}